

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O1

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  lVar3 = N_VGetArrayPointer();
  lVar4 = N_VGetArrayPointer(Y);
  iVar5 = 0;
  if (problem_size < 1) {
    bVar1 = false;
  }
  else {
    iVar7 = 0;
    lVar6 = 0;
    do {
      iVar2 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar6 * 8),*(undefined8 *)(lVar4 + lVar6 * 8));
      iVar7 = iVar7 + iVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < problem_size);
    bVar1 = 0 < iVar7;
  }
  if (bVar1) {
    if (problem_size < 1) {
      dVar8 = 0.0;
    }
    else {
      lVar6 = 0;
      dVar9 = 0.0;
      do {
        dVar8 = *(double *)(lVar3 + lVar6 * 8);
        dVar8 = ABS((dVar8 - *(double *)(lVar4 + lVar6 * 8)) / dVar8);
        if (dVar8 <= dVar9) {
          dVar8 = dVar9;
        }
        lVar6 = lVar6 + 1;
        dVar9 = dVar8;
      } while (problem_size != lVar6);
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",dVar8,tol);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);

  /* check vector data */
  for (i = 0; i < problem_size; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < problem_size; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]) / SUNRabs(Xdata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}